

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::CharSetLeaf::GetNextRange
          (CharSetLeaf *this,uint level,Char searchCharStart,Char *outLowerChar,Char *outHigherChar)

{
  code *pcVar1;
  bool bVar2;
  Char CVar3;
  uint uVar4;
  int iVar5;
  undefined4 *puVar6;
  uint local_48;
  int nextClear;
  int nextSet;
  Char *outHigherChar_local;
  Char *outLowerChar_local;
  Char searchCharStart_local;
  uint level_local;
  CharSetLeaf *this_local;
  
  uVar4 = CharSetNode::lim(level);
  if (uVar4 + 1 <= (uint)(ushort)searchCharStart) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x341,"(searchCharStart < lim(level) + 1)",
                       "searchCharStart < lim(level) + 1");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  iVar5 = CharBitvec::NextSet(&this->vec,(uint)(ushort)searchCharStart);
  if (iVar5 == -1) {
    this_local._7_1_ = false;
  }
  else {
    *outLowerChar = (Char)iVar5;
    iVar5 = CharBitvec::NextClear(&this->vec,iVar5);
    if (iVar5 == -1) {
      local_48 = CharSetNode::lim(level);
    }
    else {
      local_48 = iVar5 - 1;
    }
    CVar3 = Chars<char16_t>::UTC(local_48);
    *outHigherChar = CVar3;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool CharSetLeaf::GetNextRange(uint level, Char searchCharStart, _Out_ Char *outLowerChar, _Out_ Char *outHigherChar) const
    {
        Assert(searchCharStart < lim(level) + 1);
        int nextSet = vec.NextSet(searchCharStart);

        if (nextSet == -1)
        {
            return false;
        }

        *outLowerChar = (char16)nextSet;

        int nextClear = vec.NextClear(nextSet);

        *outHigherChar = UTC(nextClear == -1 ? lim(level) : nextClear - 1);

        return true;
    }